

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  Int IVar6;
  Int IVar7;
  Int o;
  uint uVar8;
  time_t tVar9;
  Value *pVVar10;
  Value *pVVar11;
  ulong __n;
  int index;
  uint local_6c0;
  allocator local_6b9;
  char **local_6b8;
  Value output;
  string si1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  string so1;
  string so0;
  string local_5c8;
  string local_5a8;
  StyledWriter writer;
  Value local_518;
  Value local_4f0;
  Value local_4c8;
  Value local_4a0;
  Value local_478;
  Value local_450;
  Value local_428;
  Value local_400;
  Value local_3d8;
  Value local_3b0;
  Value local_388;
  Value local_360;
  string local_338;
  string local_318;
  Value local_2f8;
  Value local_2d0;
  Value local_2a8;
  Value local_280;
  Value local_258;
  ofstream fout;
  
  if (argc == 4) {
    local_6c0 = 0xfffffffe;
    local_6b8 = argv;
    do {
      printf("Round %d\n",(ulong)(uint)turnID);
      if (turnID == 1) {
        tVar9 = time((time_t *)0x0);
        srand((uint)tVar9);
        iVar4 = rand();
        Json::Value::Value(&local_360,iVar4 % 7);
        pVVar10 = Json::Value::operator[](&logger,0);
        pVVar10 = Json::Value::operator[](pVVar10,0);
        pVVar10 = Json::Value::operator[](pVVar10,"block");
        Json::Value::operator=(pVVar10,&local_360);
        Json::Value::~Value(&local_360);
        Json::Value::Value(&local_388,0);
        pVVar10 = Json::Value::operator[](&logger,0);
        pVVar10 = Json::Value::operator[](pVVar10,0);
        pVVar10 = Json::Value::operator[](pVVar10,"color");
        Json::Value::operator=(pVVar10,&local_388);
        Json::Value::~Value(&local_388);
        Json::Value::Value(&local_3b0,iVar4 % 7);
        pVVar10 = Json::Value::operator[](&logger,0);
        pVVar10 = Json::Value::operator[](pVVar10,1);
        pVVar10 = Json::Value::operator[](pVVar10,"block");
        Json::Value::operator=(pVVar10,&local_3b0);
        Json::Value::~Value(&local_3b0);
        Json::Value::Value(&local_3d8,1);
        pVVar10 = Json::Value::operator[](&logger,0);
        pVVar10 = Json::Value::operator[](pVVar10,1);
        pVVar10 = Json::Value::operator[](pVVar10,"color");
        Json::Value::operator=(pVVar10,&local_3d8);
        Json::Value::~Value(&local_3d8);
      }
      std::__cxx11::to_string((string *)&writer,turnID);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     "in_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &writer);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     "_0.txt");
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::~string((string *)&writer);
      std::__cxx11::to_string((string *)&writer,turnID);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     "in_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &writer);
      std::operator+(&si1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout
                     ,"_1.txt");
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::~string((string *)&writer);
      std::__cxx11::string::string((string *)&local_318,(string *)&output);
      makeInput(0,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::string((string *)&local_338,(string *)&si1);
      makeInput(1,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::to_string((string *)&writer,turnID);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     "out_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &writer);
      std::operator+(&so0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout
                     ,"_0.txt");
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::~string((string *)&writer);
      std::__cxx11::to_string((string *)&writer,turnID);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     "out_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &writer);
      std::operator+(&so1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout
                     ,"_1.txt");
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::~string((string *)&writer);
      std::__cxx11::string::string((string *)&local_648,argv[1],&local_6b9);
      std::operator+(&local_628,&local_648," < ");
      std::operator+(&local_668,&local_628,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&writer,
                     &local_668," > ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&writer,
                     &so0);
      system(_fout);
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::~string((string *)&writer);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::string((string *)&local_648,argv[2],&local_6b9);
      std::operator+(&local_628,&local_648," < ");
      std::operator+(&local_668,&local_628,&si1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&writer,
                     &local_668," > ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&writer,
                     &so1);
      system(_fout);
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::~string((string *)&writer);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_648);
      Json::Value::Value((Value *)&fout,nullValue);
      Json::Value::Value((Value *)&writer,nullValue);
      std::__cxx11::string::string((string *)&local_5a8,(string *)&so0);
      getOutput(&local_258,&local_5a8);
      Json::Value::operator=((Value *)&fout,&local_258);
      Json::Value::~Value(&local_258);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::string((string *)&local_5c8,(string *)&so1);
      getOutput(&local_280,&local_5c8);
      Json::Value::operator=((Value *)&writer,&local_280);
      Json::Value::~Value(&local_280);
      std::__cxx11::string::~string((string *)&local_5c8);
      Json::Value::Value(&local_400,(Value *)&writer);
      pVVar10 = Json::Value::operator[](&logger,turnID);
      pVVar10 = Json::Value::operator[](pVVar10,0);
      Json::Value::operator=(pVVar10,&local_400);
      Json::Value::~Value(&local_400);
      Json::Value::Value(&local_428,(Value *)&fout);
      pVVar10 = Json::Value::operator[](&logger,turnID);
      pVVar10 = Json::Value::operator[](pVVar10,1);
      Json::Value::operator=(pVVar10,&local_428);
      Json::Value::~Value(&local_428);
      pVVar10 = Json::Value::operator[](&logger,turnID + -1);
      pVVar10 = Json::Value::operator[](pVVar10,0);
      pVVar10 = Json::Value::operator[](pVVar10,"block");
      IVar5 = Json::Value::asInt(pVVar10);
      pVVar10 = Json::Value::operator[]((Value *)&fout,"y");
      IVar6 = Json::Value::asInt(pVVar10);
      pVVar10 = Json::Value::operator[]((Value *)&fout,"x");
      IVar7 = Json::Value::asInt(pVVar10);
      pVVar10 = Json::Value::operator[]((Value *)&fout,"o");
      o = Json::Value::asInt(pVVar10);
      bVar2 = GameBoard::place(&gameBoard,0,IVar5,IVar6,IVar7,o);
      pVVar10 = Json::Value::operator[](&logger,turnID + -1);
      pVVar10 = Json::Value::operator[](pVVar10,0);
      pVVar10 = Json::Value::operator[](pVVar10,"block");
      IVar5 = Json::Value::asInt(pVVar10);
      piVar1 = gameBoard.typeCountForColor[0] + IVar5;
      *piVar1 = *piVar1 + 1;
      pVVar10 = Json::Value::operator[](&logger,turnID + -1);
      pVVar10 = Json::Value::operator[](pVVar10,1);
      pVVar10 = Json::Value::operator[](pVVar10,"block");
      IVar5 = Json::Value::asInt(pVVar10);
      pVVar10 = Json::Value::operator[]((Value *)&writer,"y");
      uVar8 = Json::Value::asInt(pVVar10);
      pVVar10 = Json::Value::operator[]((Value *)&writer,"x");
      IVar6 = Json::Value::asInt(pVVar10);
      pVVar10 = Json::Value::operator[]((Value *)&writer,"o");
      IVar7 = Json::Value::asInt(pVVar10);
      __n = (ulong)uVar8;
      bVar3 = GameBoard::place(&gameBoard,1,IVar5,uVar8,IVar6,IVar7);
      pVVar10 = Json::Value::operator[](&logger,turnID + -1);
      pVVar10 = Json::Value::operator[](pVVar10,1);
      pVVar10 = Json::Value::operator[](pVVar10,"block");
      IVar5 = Json::Value::asInt(pVVar10);
      piVar1 = gameBoard.typeCountForColor[1] + IVar5;
      *piVar1 = *piVar1 + 1;
      if (bVar2) {
        bVar2 = GameBoard::typeCountError(&gameBoard,1);
        if (!bVar3) {
          if (bVar2) goto LAB_0010e18f;
          goto LAB_0010e1a9;
        }
LAB_0010e15b:
        bVar3 = GameBoard::typeCountError(&gameBoard,0);
        if (bVar2 != false) {
          puts("player 0 error");
          local_6c0 = 1;
          if (bVar3) goto LAB_0010e1a9;
          local_6c0 = 1;
          goto LAB_0010e1cc;
        }
        if (bVar3) goto LAB_0010e1a9;
        GameBoard::eliminate(&gameBoard,0);
        GameBoard::eliminate(&gameBoard,1);
        iVar4 = GameBoard::transfer(&gameBoard);
        argv = local_6b8;
        if (iVar4 == -1) {
          pVVar10 = Json::Value::operator[]((Value *)&writer,"block");
          IVar5 = Json::Value::asInt(pVVar10);
          bVar2 = GameBoard::canPut(&gameBoard,0,IVar5);
          pVVar10 = Json::Value::operator[]((Value *)&fout,"block");
          IVar5 = Json::Value::asInt(pVVar10);
          bVar3 = GameBoard::canPut(&gameBoard,1,IVar5);
          if (bVar2 || bVar3) {
            __n = (ulong)local_6c0;
            if (!bVar3) {
              __n = 0;
            }
            if (!bVar2) {
              __n = 1;
            }
LAB_0010e2e8:
            local_6c0 = (uint)__n;
          }
          else {
            __n = (ulong)(uint)gameBoard.elimTotal[1];
            local_6c0 = 0xfffffffe;
            if (gameBoard.elimTotal[0] != gameBoard.elimTotal[1]) {
              __n = (ulong)(gameBoard.elimTotal[0] < gameBoard.elimTotal[1]);
              goto LAB_0010e2e8;
            }
          }
          if (!bVar2 || !bVar3) goto LAB_0010e310;
          if (turnID == 300) {
            bVar2 = false;
            local_6c0 = 0xfffffffe;
          }
          else {
            turnID = turnID + 1;
            bVar2 = true;
          }
        }
        else {
          local_6c0 = 1 - iVar4;
          __n = (ulong)local_6c0;
LAB_0010e310:
          bVar2 = false;
        }
      }
      else {
        bVar2 = true;
        if (bVar3) goto LAB_0010e15b;
LAB_0010e18f:
        puts("player 0 error");
        local_6c0 = 1;
LAB_0010e1a9:
        puts("player 1 error");
        local_6c0 = (uint)(local_6c0 != 1) * 2 - 2;
LAB_0010e1cc:
        bVar2 = false;
        argv = local_6b8;
      }
      Json::Value::~Value((Value *)&writer);
      Json::Value::~Value((Value *)&fout);
      std::__cxx11::string::~string((string *)&so1);
      std::__cxx11::string::~string((string *)&so0);
      std::__cxx11::string::~string((string *)&si1);
      std::__cxx11::string::~string((string *)&output);
    } while (bVar2);
    std::ofstream::ofstream(&fout,argv[3],_S_out);
    Json::StyledWriter::StyledWriter(&writer);
    Json::Value::Value(&output,nullValue);
    for (iVar4 = 1; iVar4 <= turnID; iVar4 = iVar4 + 1) {
      index = iVar4 + -1;
      pVVar10 = Json::Value::operator[](&output,index);
      pVVar10 = Json::Value::operator[](pVVar10,"output");
      Json::Value::Value(&local_2a8,"request");
      pVVar11 = Json::Value::operator[](pVVar10,"command");
      Json::Value::operator=(pVVar11,&local_2a8);
      Json::Value::~Value(&local_2a8);
      pVVar10 = Json::Value::operator[](pVVar10,"display");
      pVVar11 = Json::Value::operator[](&logger,index);
      pVVar11 = Json::Value::operator[](pVVar11,1);
      pVVar11 = Json::Value::operator[](pVVar11,"block");
      Json::Value::Value(&local_450,pVVar11);
      pVVar11 = Json::Value::operator[](pVVar10,"0");
      pVVar11 = Json::Value::operator[](pVVar11,"block");
      Json::Value::operator=(pVVar11,&local_450);
      Json::Value::~Value(&local_450);
      pVVar11 = Json::Value::operator[](&logger,index);
      pVVar11 = Json::Value::operator[](pVVar11,0);
      pVVar11 = Json::Value::operator[](pVVar11,"block");
      Json::Value::Value(&local_478,pVVar11);
      pVVar10 = Json::Value::operator[](pVVar10,"1");
      pVVar10 = Json::Value::operator[](pVVar10,"block");
      Json::Value::operator=(pVVar10,&local_478);
      Json::Value::~Value(&local_478);
      pVVar10 = Json::Value::operator[](&output,iVar4);
      pVVar10 = Json::Value::operator[](pVVar10,"output");
      pVVar10 = Json::Value::operator[](pVVar10,"display");
      pVVar11 = Json::Value::operator[](&logger,iVar4);
      pVVar11 = Json::Value::operator[](pVVar11,1);
      Json::Value::Value(&local_4a0,pVVar11);
      pVVar11 = Json::Value::operator[](pVVar10,"0");
      pVVar11 = Json::Value::operator[](pVVar11,"route");
      pVVar11 = Json::Value::operator[](pVVar11,0);
      Json::Value::operator=(pVVar11,&local_4a0);
      Json::Value::~Value(&local_4a0);
      pVVar11 = Json::Value::operator[](pVVar10,"0");
      pVVar11 = Json::Value::operator[](pVVar11,"route");
      pVVar11 = Json::Value::operator[](pVVar11,0);
      Json::Value::removeMember(&local_2d0,pVVar11,"block");
      Json::Value::~Value(&local_2d0);
      pVVar11 = Json::Value::operator[](&logger,iVar4);
      pVVar11 = Json::Value::operator[](pVVar11,0);
      Json::Value::Value(&local_4c8,pVVar11);
      pVVar11 = Json::Value::operator[](pVVar10,"1");
      pVVar11 = Json::Value::operator[](pVVar11,"route");
      pVVar11 = Json::Value::operator[](pVVar11,0);
      Json::Value::operator=(pVVar11,&local_4c8);
      Json::Value::~Value(&local_4c8);
      pVVar10 = Json::Value::operator[](pVVar10,"1");
      pVVar10 = Json::Value::operator[](pVVar10,"route");
      pVVar10 = Json::Value::operator[](pVVar10,0);
      Json::Value::removeMember(&local_2f8,pVVar10,"block");
      Json::Value::~Value(&local_2f8);
    }
    pVVar10 = Json::Value::operator[](&output,turnID);
    pVVar10 = Json::Value::operator[](pVVar10,"output");
    Json::Value::Value(&local_4f0,"finish");
    pVVar11 = Json::Value::operator[](pVVar10,"command");
    Json::Value::operator=(pVVar11,&local_4f0);
    Json::Value::~Value(&local_4f0);
    uVar8 = 1 - local_6c0;
    if ((int)local_6c0 < 0) {
      uVar8 = local_6c0;
    }
    Json::Value::Value(&local_518,uVar8);
    pVVar10 = Json::Value::operator[](pVVar10,"display");
    pVVar10 = Json::Value::operator[](pVVar10,"result");
    Json::Value::operator=(pVVar10,&local_518);
    Json::Value::~Value(&local_518);
    Json::StyledWriter::write_abi_cxx11_((StyledWriter *)&si1,(int)&writer,&output,__n);
    std::operator<<((ostream *)&fout,(string *)&si1);
    std::__cxx11::string::~string((string *)&si1);
    std::ofstream::close();
    iVar4 = 0;
    printf("winner:%d\n",(ulong)local_6c0);
    Json::Value::~Value(&output);
    Json::StyledWriter::~StyledWriter(&writer);
    std::ofstream::~ofstream(&fout);
  }
  else {
    iVar4 = 1;
    puts("usage: logic player1 player2 output");
    puts("this program will create lots of temporary files !!!");
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc != 4) {
        puts("usage: logic player1 player2 output");
        puts("this program will create lots of temporary files !!!");
        return 1;
    }

    int winner = -2;

    while (1) {
        printf("Round %d\n", turnID);
        if (turnID == 1) {
            srand(time(NULL));
            int first = rand() % 7;
            logger[0][0]["block"] = first;
            logger[0][0]["color"] = 0;
            logger[0][1]["block"] = first;
            logger[0][1]["color"] = 1;
        }
        string si0 = "in_" + to_string(turnID) + "_0.txt";
        string si1 = "in_" + to_string(turnID) + "_1.txt";
        makeInput(0, si0);
        makeInput(1, si1);
        string so0 = "out_" + to_string(turnID) + "_0.txt";
        string so1 = "out_" + to_string(turnID) + "_1.txt";
        system((string(argv[1]) + " < " + si0 + " > " + so0).c_str());
        system((string(argv[2]) + " < " + si1 + " > " + so1).c_str());
        Json::Value o0, o1;
        o0 = getOutput(so0);
        o1 = getOutput(so1);
        logger[turnID][0] = o1;
        logger[turnID][1] = o0;
        bool wa0, wa1;
        wa0 = !gameBoard.place(0, logger[turnID - 1][0]["block"].asInt(), o0["y"].asInt(), o0["x"].asInt(), o0["o"].asInt());
        ++gameBoard.typeCountForColor[0][logger[turnID - 1][0]["block"].asInt()];
        wa1 = !gameBoard.place(1, logger[turnID - 1][1]["block"].asInt(), o1["y"].asInt(), o1["x"].asInt(), o1["o"].asInt());
        ++gameBoard.typeCountForColor[1][logger[turnID - 1][1]["block"].asInt()];
        wa0 = wa0 || gameBoard.typeCountError(1);
        wa1 = wa1 || gameBoard.typeCountError(0);
        if (wa0) {
            puts("player 0 error");
            winner = 1;
        }
        if (wa1) {
            puts("player 1 error");
            if (winner != 1)
                winner = 0;
            else
                winner = -2;
        }
        if (wa0 || wa1)
            break;
        gameBoard.eliminate(0);
        gameBoard.eliminate(1);
        int wa = gameBoard.transfer();
        if (wa != -1) {
            winner = 1 - wa;
            break;
        }
        wa0 = !gameBoard.canPut(0, o1["block"].asInt());
        wa1 = !gameBoard.canPut(1, o0["block"].asInt());
        if (wa0 && wa1) {
            winner = gameBoard.elimTotal[0] - gameBoard.elimTotal[1];
            if (winner == 0)
                winner = -2;
            else
                winner = (winner < 0 ? 1 : 0);
        }
        else if (wa0)
            winner = 1;
        else if (wa1)
            winner = 0;
        if (wa0 || wa1)
            break;
        if (turnID == 300) {
            winner = -2;
            break;
        }
        ++turnID;
    }

    ofstream fout(argv[3]);
    Json::StyledWriter writer;
    Json::Value output;
    for (int i = 1; i <= turnID; ++i) {
        auto &o = output[i - 1]["output"];
        o["command"] = "request";
        auto &d = o["display"];
        d["0"]["block"] = logger[i - 1][1]["block"];
        d["1"]["block"] = logger[i - 1][0]["block"];
        auto &d2 = output[i]["output"]["display"];
        d2["0"]["route"][0] = logger[i][1];
        d2["0"]["route"][0].removeMember("block");
        d2["1"]["route"][0] = logger[i][0];
        d2["1"]["route"][0].removeMember("block");
    }
    auto &o = output[turnID]["output"];
    o["command"] = "finish";
    o["display"]["result"] = (winner >= 0 ? 1 - winner : winner);
    fout << writer.write(output);
    fout.close();
    printf("winner:%d\n",winner);
    return 0;
}